

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     local_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  int iVar1;
  bool bVar2;
  difference_type dVar3;
  reference piVar4;
  int *piVar5;
  int local_34;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_30;
  T val;
  int *local_28;
  min<int> local_19;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  _Stack_30._M_current = end._M_current;
  local_28 = begin._M_current;
  local_18._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  dVar3 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (begin,end);
  if (dVar3 != 0) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&end_local);
    local_34 = *piVar4;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&end_local);
    while (bVar2 = __gnu_cxx::operator!=(&end_local,&local_18), bVar2) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&end_local);
      piVar5 = min<int>::operator()(&local_19,&local_34,piVar4);
      iVar1 = *piVar5;
      local_34 = iVar1;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&end_local);
      *piVar4 = iVar1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&end_local);
    }
  }
  return;
}

Assistant:

void local_scan_inplace(Iterator begin, Iterator end, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<Iterator>::value_type T;

    // start from first element
    T val = *begin;
    ++begin;

    // calculate the inclusive prefix sum
    while (begin != end) {
        val = func(val,*begin);
        *begin = val;
        ++begin;
    }
}